

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dragons-recognizer.cpp
# Opt level: O3

set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> * __thiscall
mahjong::DragonsRecognizer::recognize
          (set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
           *__return_storage_ptr__,DragonsRecognizer *this)

{
  _Rb_tree_header *p_Var1;
  less<mahjong::Pattern> *__comp;
  Pattern *pPVar2;
  allocator_type *__a;
  initializer_list<mahjong::Pattern> __l;
  allocator_type local_14;
  less<mahjong::Pattern> local_13;
  allocator_type local_12;
  less<mahjong::Pattern> local_11;
  Pattern local_10 [2];
  
  if ((this->dragon_count == 2 & this->is_dragon_pair) == 1) {
    pPVar2 = local_10 + 1;
    local_10[1] = 0x1f;
    __comp = &local_11;
    __a = &local_12;
  }
  else {
    if (this->dragon_count != 3) {
      p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
      *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
      *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
      return __return_storage_ptr__;
    }
    pPVar2 = local_10;
    local_10[0] = BigThreeDragons;
    __comp = &local_13;
    __a = &local_14;
  }
  __l._M_len = 1;
  __l._M_array = pPVar2;
  std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::set
            (__return_storage_ptr__,__l,__comp,__a);
  return __return_storage_ptr__;
}

Assistant:

std::set<Pattern> DragonsRecognizer::recognize()
{
	if (is_dragon_pair && dragon_count == 2)
	{
		return { Pattern::LittleThreeDragons };
	}

	if (dragon_count == 3)
	{
		return { Pattern::BigThreeDragons };
	}

	return {};
}